

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_context.cc
# Opt level: O0

void init_context(module *m)

{
  class_<kratos::Context> *pcVar1;
  code *local_1d0;
  undefined8 local_1c8;
  code *local_1c0;
  undefined8 local_1b8;
  code *local_1b0;
  undefined8 local_1a8;
  return_value_policy local_199;
  arg local_198;
  arg local_188;
  arg local_178;
  code *local_168;
  undefined8 local_160;
  type local_151;
  arg local_150;
  code *local_140;
  undefined8 local_138;
  arg local_130;
  code *local_120;
  undefined8 local_118;
  arg local_110;
  arg local_100;
  code *local_f0;
  undefined8 local_e8;
  code *local_e0;
  undefined8 local_d8;
  arg local_d0;
  code *local_c0;
  undefined8 local_b8;
  arg local_b0;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  return_value_policy local_79;
  code *local_78;
  undefined8 local_70;
  return_value_policy local_61;
  code *local_60;
  undefined8 local_58;
  return_value_policy local_49;
  code *local_48;
  undefined8 local_40;
  constructor<> local_21;
  PyObject *local_20;
  class_<kratos::Context> local_18;
  class_<kratos::Context> context;
  module *m_local;
  
  local_20 = (m->super_object).super_handle.m_ptr;
  context.super_generic_type.super_object.super_handle.m_ptr = (generic_type)(generic_type)m;
  pybind11::class_<kratos::Context>::class_<>(&local_18,(handle)local_20,"Context");
  pybind11::init<>();
  pcVar1 = pybind11::class_<kratos::Context>::def<>(&local_18,&local_21);
  local_48 = kratos::Context::generator;
  local_40 = 0;
  local_49 = reference;
  pcVar1 = pybind11::class_<kratos::Context>::
           def<kratos::Generator&(kratos::Context::*)(std::__cxx11::string_const&),pybind11::return_value_policy>
                     (pcVar1,"generator",(offset_in_Var_to_subr *)&local_48,&local_49);
  local_60 = kratos::Context::empty_generator;
  local_58 = 0;
  local_61 = reference;
  pcVar1 = pybind11::class_<kratos::Context>::
           def<kratos::Generator&(kratos::Context::*)(),pybind11::return_value_policy>
                     (pcVar1,"empty_generator",(offset_in_Var_to_subr *)&local_60,&local_61);
  local_78 = kratos::Context::testbench;
  local_70 = 0;
  local_79 = reference;
  pcVar1 = pybind11::class_<kratos::Context>::
           def<kratos::TestBench&(kratos::Context::*)(std::__cxx11::string_const&),pybind11::return_value_policy>
                     (pcVar1,"testbench",(offset_in_Var_to_subr *)&local_78,&local_79);
  local_90 = kratos::Context::clear;
  local_88 = 0;
  pcVar1 = pybind11::class_<kratos::Context>::def<void(kratos::Context::*)()>
                     (pcVar1,"clear",(offset_in_Var_to_subr *)&local_90);
  local_a0 = kratos::Context::get_hash;
  local_98 = 0;
  pybind11::arg::arg(&local_b0,"internal_generator");
  pcVar1 = pybind11::class_<kratos::Context>::
           def<unsigned_long(kratos::Context::*)(kratos::Generator_const*)const,pybind11::arg>
                     (pcVar1,"get_hash",(offset_in_Var_to_subr *)&local_a0,&local_b0);
  local_c0 = kratos::Context::get_generators_by_name;
  local_b8 = 0;
  pybind11::arg::arg(&local_d0,"name");
  pcVar1 = pybind11::class_<kratos::Context>::
           def<std::set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>(kratos::Context::*)(std::__cxx11::string_const&)const,pybind11::arg>
                     (pcVar1,"get_generators_by_name",(offset_in_Var_to_subr *)&local_c0,&local_d0);
  local_e0 = kratos::Context::hash_table_size;
  local_d8 = 0;
  pcVar1 = pybind11::class_<kratos::Context>::def<unsigned_long(kratos::Context::*)()const>
                     (pcVar1,"hash_table_size",(offset_in_Var_to_subr *)&local_e0);
  local_f0 = kratos::Context::change_generator_name;
  local_e8 = 0;
  pybind11::arg::arg(&local_100,"internal_generator");
  pybind11::arg::arg(&local_110,"new_name");
  pcVar1 = pybind11::class_<kratos::Context>::
           def<void(kratos::Context::*)(kratos::Generator*,std::__cxx11::string_const&),pybind11::arg,pybind11::arg>
                     (pcVar1,"change_generator_name",(offset_in_Var_to_subr *)&local_f0,&local_100,
                      &local_110);
  local_120 = kratos::Context::add;
  local_118 = 0;
  pybind11::arg::arg(&local_130,"internal_generator");
  pcVar1 = pybind11::class_<kratos::Context>::
           def<void(kratos::Context::*)(kratos::Generator*),pybind11::arg>
                     (pcVar1,"add",(offset_in_Var_to_subr *)&local_120,&local_130);
  local_140 = kratos::Context::has_hash;
  local_138 = 0;
  pybind11::arg::arg(&local_150,"internal_generator");
  pcVar1 = pybind11::class_<kratos::Context>::
           def<bool(kratos::Context::*)(kratos::Generator_const*)const,pybind11::arg>
                     (pcVar1,"has_hash",(offset_in_Var_to_subr *)&local_140,&local_150);
  pcVar1 = pybind11::class_<kratos::Context>::def<init_context(pybind11::module_&)::__0>
                     (pcVar1,"clear_hash",&local_151);
  local_168 = kratos::Context::enum_;
  local_160 = 0;
  pybind11::arg::arg(&local_178,"enum_name");
  pybind11::arg::arg(&local_188,"definition");
  pybind11::arg::arg(&local_198,"width");
  local_199 = reference;
  pcVar1 = pybind11::class_<kratos::Context>::
           def<kratos::Enum&(kratos::Context::*)(std::__cxx11::string_const&,std::map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,unsigned_int),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::return_value_policy>
                     (pcVar1,"enum",(offset_in_Var_to_subr *)&local_168,&local_178,&local_188,
                      &local_198,&local_199);
  local_1b0 = kratos::Context::has_enum;
  local_1a8 = 0;
  pcVar1 = pybind11::class_<kratos::Context>::
           def<bool(kratos::Context::*)(std::__cxx11::string_const&)const>
                     (pcVar1,"has_enum",(offset_in_Var_to_subr *)&local_1b0);
  local_1c0 = kratos::Context::track_generated;
  local_1b8 = 0;
  local_1d0 = kratos::Context::set_track_generated;
  local_1c8 = 0;
  pybind11::class_<kratos::Context>::
  def_property<bool(kratos::Context::*)()const,void(kratos::Context::*)(bool)>
            (pcVar1,"track_generated",(offset_in_Var_to_subr *)&local_1c0,
             (offset_in_Var_to_subr *)&local_1d0);
  pybind11::class_<kratos::Context>::~class_(&local_18);
  return;
}

Assistant:

void init_context(py::module &m) {
    using namespace kratos;
    auto context = py::class_<Context>(m, "Context");
    context.def(py::init())
        .def("generator", &Context::generator, py::return_value_policy::reference)
        .def("empty_generator", &Context::empty_generator, py::return_value_policy::reference)
        .def("testbench", &Context::testbench, py::return_value_policy::reference)
        .def("clear", &Context::clear)
        .def("get_hash", &Context::get_hash, py::arg("internal_generator"))
        .def("get_generators_by_name", &Context::get_generators_by_name, py::arg("name"))
        .def("hash_table_size", &Context::hash_table_size)
        .def("change_generator_name", &Context::change_generator_name,
             py::arg("internal_generator"), py::arg("new_name"))
        .def("add", &Context::add, py::arg("internal_generator"))
        .def("has_hash", &Context::has_hash, py::arg("internal_generator"))
        .def("clear_hash",
             [](Context &context) {
               // the original one gives segfault for g++-8. don't know why
               context.clear_hash();
             })
        .def("enum", &Context::enum_, py::arg("enum_name"), py::arg("definition"),
             py::arg("width"), py::return_value_policy::reference)
        .def("has_enum", &Context::has_enum)
        .def_property("track_generated", &Context::track_generated, &Context::set_track_generated);
}